

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O1

InfoStatus
checkInfo(HighsLogOptions *report_log_options,
         vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records)

{
  HighsInfoType HVar1;
  InfoRecord *pIVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  InfoRecord *pIVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  HighsInt check_index;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  string name;
  string check_name;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  uVar7 = (uint)((ulong)((long)(info_records->
                               super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(info_records->
                              super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar7) {
    uVar8 = (ulong)(uVar7 & 0x7fffffff);
    uVar11 = 0;
    bVar10 = false;
    do {
      local_70 = local_60;
      pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar11];
      pcVar3 = (pIVar2->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (pIVar2->name)._M_string_length);
      HVar1 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar11]->type;
      uVar9 = 0;
      do {
        if (uVar11 != uVar9) {
          pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar9];
          pcVar3 = (pIVar2->name)._M_dataplus._M_p;
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + (pIVar2->name)._M_string_length);
          if ((local_48 == local_68) &&
             ((local_48 == 0 || (iVar6 = bcmp(local_50,local_70,local_48), iVar6 == 0)))) {
            bVar10 = true;
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same name as info %d \"%s\"\n",
                         uVar11 & 0xffffffff,local_70,uVar9 & 0xffffffff,local_50);
          }
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      if (HVar1 == kInt64) {
        pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar11];
        pp_Var4 = pIVar2[1]._vptr_InfoRecord;
        uVar9 = 0;
        do {
          if (((uVar11 != uVar9) &&
              (pIVar5 = (info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar9], pIVar5->type == kInt64)) &&
             (pIVar5[1]._vptr_InfoRecord == pp_Var4)) {
            bVar10 = true;
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,uVar11 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar9 & 0xffffffff,
                         (pIVar5->name)._M_dataplus._M_p);
          }
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      else if (HVar1 == kInt) {
        pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar11];
        pp_Var4 = pIVar2[1]._vptr_InfoRecord;
        uVar9 = 0;
        do {
          if (((uVar11 != uVar9) &&
              (pIVar5 = (info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar9], pIVar5->type == kInt)) &&
             (pIVar5[1]._vptr_InfoRecord == pp_Var4)) {
            bVar10 = true;
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,uVar11 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar9 & 0xffffffff,
                         (pIVar5->name)._M_dataplus._M_p);
          }
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      else if (HVar1 == kDouble) {
        pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar11];
        pp_Var4 = pIVar2[1]._vptr_InfoRecord;
        uVar9 = 0;
        do {
          if (((uVar11 != uVar9) &&
              (pIVar5 = (info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar9], pIVar5->type == kDouble)) &&
             (pIVar5[1]._vptr_InfoRecord == pp_Var4)) {
            bVar10 = true;
            highsLogUser(report_log_options,kError,
                         "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                         ,uVar11 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar9 & 0xffffffff,
                         (pIVar5->name)._M_dataplus._M_p);
          }
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar8);
    if (bVar10) {
      return kIllegalValue;
    }
  }
  highsLogUser(report_log_options,kInfo,"checkInfo: Info are OK\n");
  return kOk;
}

Assistant:

InfoStatus checkInfo(const HighsLogOptions& report_log_options,
                     const std::vector<InfoRecord*>& info_records) {
  bool error_found = false;
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    std::string name = info_records[index]->name;
    HighsInfoType type = info_records[index]->type;
    // Check that there are no other info with the same name
    for (HighsInt check_index = 0; check_index < num_info; check_index++) {
      if (check_index == index) continue;
      std::string check_name = info_records[check_index]->name;
      if (check_name == name) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "checkInfo: Info %" HIGHSINT_FORMAT
                     " (\"%s\") has the same name as info %" HIGHSINT_FORMAT
                     " \"%s\"\n",
                     index, name.c_str(), check_index, check_name.c_str());
        error_found = true;
      }
    }
    if (type == HighsInfoType::kInt64) {
      // Check int64_t info
      InfoRecordInt64& info = ((InfoRecordInt64*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      int64_t* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt64& check_info =
            ((InfoRecordInt64*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt64) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kInt) {
      // Check HighsInt info
      InfoRecordInt& info = ((InfoRecordInt*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      HighsInt* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt& check_info =
            ((InfoRecordInt*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kDouble) {
      // Check double info
      InfoRecordDouble& info = ((InfoRecordDouble*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      double* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordDouble& check_info =
            ((InfoRecordDouble*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kDouble) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    }
  }
  if (error_found) return InfoStatus::kIllegalValue;
  highsLogUser(report_log_options, HighsLogType::kInfo,
               "checkInfo: Info are OK\n");
  return InfoStatus::kOk;
}